

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int resolveCompoundOrderBy(Parse *pParse,Select *pSelect)

{
  byte *pbVar1;
  undefined1 *puVar2;
  uint uVar3;
  ExprList *pEVar4;
  sqlite3 *db;
  Parse *pParse_00;
  Expr *pEVar5;
  bool bVar6;
  Select *pSVar7;
  Select *pSVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  Expr *pEVar12;
  ExprList_item *pEVar13;
  long lVar14;
  Expr *pE;
  Expr *pEVar15;
  ulong uVar16;
  int iVar17;
  Expr *p;
  ExprList_item *pEVar18;
  long in_FS_OFFSET;
  int iCol;
  int local_4c;
  Token local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pEVar4 = pSelect->pOrderBy;
  if (pEVar4 != (ExprList *)0x0) {
    db = pParse->db;
    uVar3 = pEVar4->nExpr;
    uVar11 = (ulong)uVar3;
    if (db->aLimit[2] < (int)uVar3) {
      sqlite3ErrorMsg(pParse,"too many terms in ORDER BY clause");
LAB_00183dd9:
      iVar17 = 1;
      goto LAB_00183dde;
    }
    if (0 < (int)uVar3) {
      lVar14 = 0;
      do {
        pbVar1 = &pEVar4->a[0].fg.field_0x1 + lVar14;
        *pbVar1 = *pbVar1 & 0xfb;
        lVar14 = lVar14 + 0x18;
      } while (uVar11 * 0x18 != lVar14);
    }
    pSelect->pNext = (Select *)0x0;
    pSVar8 = pSelect->pPrior;
    while (pSVar7 = pSVar8, pSVar7 != (Select *)0x0) {
      pSVar7->pNext = pSelect;
      pSelect = pSVar7;
      pSVar8 = pSVar7->pPrior;
    }
    do {
      if ((int)uVar11 < 1) goto LAB_00183dbd;
      pParse_00 = (Parse *)pSelect->pEList;
      bVar6 = false;
      iVar17 = 0;
      pEVar18 = pEVar4->a;
      do {
        local_4c = -1;
        if (((pEVar18->fg).field_0x1 & 4) == 0) {
          p = pEVar18->pExpr;
          while (p != (Expr *)0x0) {
            if ((p->flags & 0x82000) == 0) {
LAB_00183c17:
              iVar9 = sqlite3ExprIsInteger(p,&local_4c,(Parse *)0x0);
              if (iVar9 == 0) {
                iVar10 = resolveAsName(pParse_00,(ExprList *)p,pE);
                local_4c = iVar10;
                if (iVar10 == 0) {
                  pEVar12 = exprDup(db,p,0,(EdupBuf *)0x0);
                  iVar10 = 0;
                  if (((db->mallocFailed == '\0') &&
                      (iVar10 = resolveOrderByTermToExprList(pParse,pSelect,pEVar12),
                      local_4c = iVar10, 1 < pParse->eParseMode)) && (0 < iVar10)) {
                    resolveOrderByTermToExprList(pParse,pSelect,p);
                  }
                  if (pEVar12 != (Expr *)0x0) {
                    sqlite3ExprDeleteNN(db,pEVar12);
                  }
                }
                if (iVar10 < 1) {
                  bVar6 = true;
                  break;
                }
              }
              else {
                iVar9 = *(int *)&pParse_00->db;
                if ((local_4c < 1) || (iVar10 = local_4c, iVar9 < local_4c)) {
                  resolveOutOfRangeError(pParse,"ORDER",iVar17 + 1,iVar9,p);
                  goto LAB_00183dd9;
                }
              }
              if (1 < pParse->eParseMode) goto LAB_00183d57;
              local_48.n = 0;
              local_48._12_4_ = 0xaaaaaaaa;
              local_48.z = (char *)0x0;
              pEVar12 = sqlite3ExprAlloc(db,0x9c,&local_48,0);
              if (pEVar12 != (Expr *)0x0) {
                pbVar1 = (byte *)((long)&pEVar12->flags + 1);
                *pbVar1 = *pbVar1 | 8;
                (pEVar12->u).iValue = iVar10;
                pEVar13 = pEVar18;
                pEVar5 = pEVar18->pExpr;
                if (pEVar18->pExpr != p) {
                  do {
                    pEVar15 = pEVar5;
                    pEVar5 = pEVar15->pLeft;
                  } while (pEVar5->op == 'r');
                  pEVar13 = (ExprList_item *)&pEVar15->pLeft;
                }
                pEVar13->pExpr = pEVar12;
                sqlite3ExprDeleteNN(db,p);
                (pEVar18->u).x.iOrderByCol = (u16)iVar10;
LAB_00183d57:
                puVar2 = &(pEVar18->fg).field_0x1;
                *puVar2 = *puVar2 | 4;
                break;
              }
              goto LAB_00183dd9;
            }
            if ((p->flags >> 0x13 & 1) == 0) {
              if (p->op != 'r') goto LAB_00183c17;
              pEVar13 = (ExprList_item *)&p->pLeft;
            }
            else {
              pEVar13 = ((p->x).pList)->a;
            }
            p = pEVar13->pExpr;
          }
        }
        iVar17 = iVar17 + 1;
        pEVar18 = pEVar18 + 1;
        uVar3 = pEVar4->nExpr;
        uVar11 = (ulong)uVar3;
      } while (iVar17 < (int)uVar3);
      pSelect = pSelect->pNext;
    } while ((pSelect != (Select *)0x0) && (bVar6));
    if (0 < (int)uVar3) {
      uVar16 = 1;
      lVar14 = 0;
      do {
        if (((&pEVar4->a[0].fg.field_0x1)[lVar14] & 4) == 0) {
          sqlite3ErrorMsg(pParse,"%r ORDER BY term does not match any column in the result set",
                          uVar16);
          goto LAB_00183dd9;
        }
        uVar16 = (ulong)((int)uVar16 + 1);
        lVar14 = lVar14 + 0x18;
        iVar17 = 0;
      } while (uVar11 * 0x18 != lVar14);
      goto LAB_00183dde;
    }
  }
LAB_00183dbd:
  iVar17 = 0;
LAB_00183dde:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar17;
  }
  __stack_chk_fail();
}

Assistant:

static int resolveCompoundOrderBy(
  Parse *pParse,        /* Parsing context.  Leave error messages here */
  Select *pSelect       /* The SELECT statement containing the ORDER BY */
){
  int i;
  ExprList *pOrderBy;
  ExprList *pEList;
  sqlite3 *db;
  int moreToDo = 1;

  pOrderBy = pSelect->pOrderBy;
  if( pOrderBy==0 ) return 0;
  db = pParse->db;
  if( pOrderBy->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many terms in ORDER BY clause");
    return 1;
  }
  for(i=0; i<pOrderBy->nExpr; i++){
    pOrderBy->a[i].fg.done = 0;
  }
  pSelect->pNext = 0;
  while( pSelect->pPrior ){
    pSelect->pPrior->pNext = pSelect;
    pSelect = pSelect->pPrior;
  }
  while( pSelect && moreToDo ){
    struct ExprList_item *pItem;
    moreToDo = 0;
    pEList = pSelect->pEList;
    assert( pEList!=0 );
    for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
      int iCol = -1;
      Expr *pE, *pDup;
      if( pItem->fg.done ) continue;
      pE = sqlite3ExprSkipCollateAndLikely(pItem->pExpr);
      if( NEVER(pE==0) ) continue;
      if( sqlite3ExprIsInteger(pE, &iCol, 0) ){
        if( iCol<=0 || iCol>pEList->nExpr ){
          resolveOutOfRangeError(pParse, "ORDER", i+1, pEList->nExpr, pE);
          return 1;
        }
      }else{
        iCol = resolveAsName(pParse, pEList, pE);
        if( iCol==0 ){
          /* Now test if expression pE matches one of the values returned
          ** by pSelect. In the usual case this is done by duplicating the
          ** expression, resolving any symbols in it, and then comparing
          ** it against each expression returned by the SELECT statement.
          ** Once the comparisons are finished, the duplicate expression
          ** is deleted.
          **
          ** If this is running as part of an ALTER TABLE operation and
          ** the symbols resolve successfully, also resolve the symbols in the
          ** actual expression. This allows the code in alter.c to modify
          ** column references within the ORDER BY expression as required.  */
          pDup = sqlite3ExprDup(db, pE, 0);
          if( !db->mallocFailed ){
            assert(pDup);
            iCol = resolveOrderByTermToExprList(pParse, pSelect, pDup);
            if( IN_RENAME_OBJECT && iCol>0 ){
              resolveOrderByTermToExprList(pParse, pSelect, pE);
            }
          }
          sqlite3ExprDelete(db, pDup);
        }
      }
      if( iCol>0 ){
        /* Convert the ORDER BY term into an integer column number iCol,
        ** taking care to preserve the COLLATE clause if it exists. */
        if( !IN_RENAME_OBJECT ){
          Expr *pNew = sqlite3Expr(db, TK_INTEGER, 0);
          if( pNew==0 ) return 1;
          pNew->flags |= EP_IntValue;
          pNew->u.iValue = iCol;
          if( pItem->pExpr==pE ){
            pItem->pExpr = pNew;
          }else{
            Expr *pParent = pItem->pExpr;
            assert( pParent->op==TK_COLLATE );
            while( pParent->pLeft->op==TK_COLLATE ) pParent = pParent->pLeft;
            assert( pParent->pLeft==pE );
            pParent->pLeft = pNew;
          }
          sqlite3ExprDelete(db, pE);
          pItem->u.x.iOrderByCol = (u16)iCol;
        }
        pItem->fg.done = 1;
      }else{
        moreToDo = 1;
      }
    }
    pSelect = pSelect->pNext;
  }
  for(i=0; i<pOrderBy->nExpr; i++){
    if( pOrderBy->a[i].fg.done==0 ){
      sqlite3ErrorMsg(pParse, "%r ORDER BY term does not match any "
            "column in the result set", i+1);
      return 1;
    }
  }
  return 0;
}